

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O2

void __thiscall
MILBlob::Blob::StorageWriter::Impl::Impl(Impl *this,string *filePath,bool truncateFile)

{
  unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_> *__args;
  storage_header *psVar1;
  FileWriter *this_00;
  uint64_t uVar2;
  runtime_error *this_01;
  Span<const_unsigned_char,_18446744073709551615UL> data;
  Span<const_unsigned_char,_18446744073709551615UL> data_00;
  Span<unsigned_char,_18446744073709551615UL> destData;
  bool truncateFile_local;
  
  std::__cxx11::string::string((string *)this,(string *)filePath);
  __args = &this->m_fileWriter;
  std::make_unique<MILBlob::Blob::FileWriter,std::__cxx11::string_const&,bool&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
             (bool *)filePath);
  psVar1 = &this->m_header;
  (this->m_header).count = 0;
  (this->m_header).version = 2;
  (this->m_header).reserved_0 = 0;
  (this->m_header).reserved_1 = 0;
  (this->m_header).reserved_2 = 0;
  (this->m_header).reserved_3 = 0;
  (this->m_header).reserved_6 = 0;
  (this->m_header).reserved_4 = 0;
  (this->m_header).reserved_5 = 0;
  this_00 = (this->m_fileWriter)._M_t.
            super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
            ._M_t.
            super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
            .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl;
  if (truncateFile) {
    data.m_size.m_size = 0x40;
    data.m_ptr = (pointer)psVar1;
    FileWriter::WriteData(this_00,data,0);
  }
  else {
    uVar2 = FileWriter::GetFileSize(this_00);
    if (uVar2 != 0) {
      if (uVar2 < 0x40) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,
                   "[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
      }
      else {
        destData.m_size.m_size = 0x40;
        destData.m_ptr = (pointer)psVar1;
        FileWriter::ReadData
                  ((__args->_M_t).
                   super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
                   .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl,0,
                   destData);
        if ((this->m_header).version == 2) {
          return;
        }
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_01,
                   "[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
      }
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    data_00.m_size.m_size = 0x40;
    data_00.m_ptr = (pointer)psVar1;
    FileWriter::WriteData
              ((__args->_M_t).
               super___uniq_ptr_impl<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>
               ._M_t.
               super__Tuple_impl<0UL,_MILBlob::Blob::FileWriter_*,_std::default_delete<MILBlob::Blob::FileWriter>_>
               .super__Head_base<0UL,_MILBlob::Blob::FileWriter_*,_false>._M_head_impl,data_00,0);
  }
  return;
}

Assistant:

Impl(const std::string& filePath, bool truncateFile)
        : m_filePath(filePath)
        , m_fileWriter(std::make_unique<FileWriter>(filePath, truncateFile))
    {
        if (truncateFile) {
            m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
        } else {
            auto fileSize = m_fileWriter->GetFileSize();
            if (fileSize == 0) {
                // File exists and is empty
                m_fileWriter->WriteData(CastAndMakeSpan(m_header), 0);
            } else if (static_cast<size_t>(fileSize) >= sizeof(m_header)) {
                m_fileWriter->ReadData(0, CastAndMakeSpan(m_header));
                if (m_header.version != 2) {
                    // File exists and header is incorrect
                    // File is not empty, please use truncate option
                    throw std::runtime_error(
                        "[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
                }
            } else {
                // File is not empty, please use truncate option
                throw std::runtime_error("[MIL StorageWriter]: Incorrect file header, please use truncateFile=true");
            }
        }
    }